

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

curl_off_t Curl_mime_size(curl_mimepart *part)

{
  curl_off_t cVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  curl_mimepart *part_00;
  curl_off_t cVar6;
  curl_slist *pcVar7;
  
  if (part->kind == MIMEKIND_MULTIPART) {
    if (part->arg == (void *)0x0) {
      cVar6 = 0;
    }
    else {
      part_00 = *(curl_mimepart **)((long)part->arg + 8);
      cVar6 = 0x34;
      if (part_00 != (curl_mimepart *)0x0) {
        do {
          cVar1 = Curl_mime_size(part_00);
          if (cVar1 < 0) {
            cVar6 = cVar1;
          }
          lVar4 = cVar1 + 0x34;
          if (cVar6 < 0) {
            lVar4 = 0;
          }
          cVar6 = cVar6 + lVar4;
          part_00 = part_00->nextpart;
        } while (part_00 != (curl_mimepart *)0x0);
      }
    }
    part->datasize = cVar6;
  }
  if (part->encoder == (mime_encoder *)0x0) {
    cVar6 = part->datasize;
  }
  else {
    cVar6 = (*part->encoder->sizefunc)(part);
  }
  if ((-1 < cVar6) && ((part->flags & 2) == 0)) {
    lVar4 = 0;
    for (pcVar7 = part->curlheaders; pcVar7 != (curl_slist *)0x0; pcVar7 = pcVar7->next) {
      sVar2 = strlen(pcVar7->data);
      lVar4 = lVar4 + sVar2 + 2;
    }
    lVar5 = 0;
    for (pcVar7 = part->userheaders; pcVar7 != (curl_slist *)0x0; pcVar7 = pcVar7->next) {
      pcVar3 = match_header(pcVar7,"Content-Type",0xc);
      if (pcVar3 == (char *)0x0) {
        sVar2 = strlen(pcVar7->data);
        lVar5 = lVar5 + sVar2 + 2;
      }
    }
    cVar6 = cVar6 + lVar4 + lVar5 + 2;
  }
  return cVar6;
}

Assistant:

curl_off_t Curl_mime_size(curl_mimepart *part)
{
  curl_off_t size;

  if(part->kind == MIMEKIND_MULTIPART)
    part->datasize = multipart_size(part->arg);

  size = part->datasize;

  if(part->encoder)
    size = part->encoder->sizefunc(part);

  if(size >= 0 && !(part->flags & MIME_BODY_ONLY)) {
    /* Compute total part size. */
    size += slist_size(part->curlheaders, 2, NULL, 0);
    size += slist_size(part->userheaders, 2, STRCONST("Content-Type"));
    size += 2;    /* CRLF after headers. */
  }
  return size;
}